

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O3

void __thiscall MeterPrivate::drawRanges(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  uint uVar1;
  QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
  *pQVar2;
  undefined1 auVar3 [16];
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  QBrush local_68 [8];
  QPen local_60 [8];
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  uVar1 = this->startScaleAngle;
  params->scaleDegree = (double)(this->stopScaleAngle - uVar1);
  params->startScaleAngle = (double)uVar1;
  auVar8._0_8_ = (double)this->radius;
  params->scaleWidth = auVar8._0_8_ / 30.0;
  auVar8._8_8_ = auVar8._0_8_;
  auVar6 = divpd(auVar8,_DAT_0010c0c0);
  params->margin = (qreal)auVar6._0_8_;
  params->gridLabelSize = (qreal)auVar6._8_8_;
  dStack_40 = (auVar8._0_8_ / 30.0) * 0.5 + auVar6._0_8_;
  params->fontPixelSize = auVar6._8_8_ * 0.75;
  local_58 = (params->rect).xp + dStack_40;
  dStack_50 = (params->rect).yp + dStack_40;
  local_48 = ((params->rect).w - dStack_40) - dStack_40;
  dStack_40 = ((params->rect).h - dStack_40) - dStack_40;
  QPainter::save();
  pQVar2 = (this->ranges).d.d;
  if (pQVar2 == (QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
                 *)0x0) {
    p_Var4 = (_Base_ptr)0x0;
  }
  else {
    p_Var4 = (pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  p_Var5 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar2 == (QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
                 *)0x0) {
    p_Var5 = (_Base_ptr)0x0;
  }
  if (p_Var4 != p_Var5) {
    do {
      QBrush::QBrush(local_68,&p_Var4[1]._M_right,1);
      QPen::QPen((QPen *)params->scaleWidth,local_60,local_68,1,0x10,0x40);
      QPainter::setPen((QPen *)painter);
      QPen::~QPen(local_60);
      QBrush::~QBrush(local_68);
      dVar7 = this->maxValue - this->minValue;
      auVar6._0_8_ = p_Var4[1]._M_parent;
      auVar6._8_8_ = p_Var4[1]._M_left;
      auVar3._8_8_ = dVar7;
      auVar3._0_8_ = dVar7;
      auVar8 = divpd(auVar6,auVar3);
      QPainter::drawArc((QRectF *)painter,(int)&local_58,
                        (int)((-90.0 - (params->startScaleAngle + params->scaleDegree * auVar8._0_8_
                                       )) * 16.0));
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != p_Var5);
  }
  QPainter::restore();
  return;
}

Assistant:

void
MeterPrivate::drawRanges( QPainter & painter, DrawParams & params )
{
	params.scaleDegree = stopScaleAngle - startScaleAngle;
	params.startScaleAngle = startScaleAngle;
	params.margin = radius / 20.0;

	const qreal gridLabelSizeFactor = 10.0;

	params.scaleWidth = radius / ( gridLabelSizeFactor + 20.0 );
	params.gridLabelSize = radius / gridLabelSizeFactor;
	params.fontPixelSize = params.gridLabelSize * 0.75;

	const qreal m = params.margin + params.scaleWidth / 2.0;

	const QRectF r = params.rect - QMarginsF( m, m, m,m );

	painter.save();

	for( auto it = ranges.cbegin(), last = ranges.cend(); it != last; ++it )
	{
		painter.setPen( QPen( it.value().color, params.scaleWidth ) );
		const qreal angle = params.startScaleAngle +
			params.scaleDegree * ( it.value().start / ( maxValue - minValue ) );
		const qreal span = params.startScaleAngle +
			params.scaleDegree * ( it.value().stop / ( maxValue - minValue ) ) - angle;
		painter.drawArc( r, ( -90.0 - angle ) * 16, -span * 16 );
	}

	painter.restore();
}